

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype,LazyEagerVerifyFnType verify_func,LazyAnnotation is_lazy)

{
  ExtensionInfo local_40;
  
  if ((type & 0xfe) == 10) {
    local_40.is_lazy = is_lazy;
    local_40.descriptor = (FieldDescriptor *)0x0;
    local_40.lazy_eager_verify_func = verify_func;
    local_40.message = extendee;
    local_40.number = number;
    local_40.type = type;
    local_40.is_repeated = is_repeated;
    local_40.is_packed = is_packed;
    local_40.field_6.message_info.tc_table = MessageLite::GetTcParseTable(prototype);
    local_40.field_6.message_info.prototype = prototype;
    anon_unknown_58::Register(&local_40);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0xaa,0x4a,"type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP"
            );
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype,
                                            LazyEagerVerifyFnType verify_func,
                                            LazyAnnotation is_lazy) {
  ABSL_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
             type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed,
                     verify_func, is_lazy);
  info.message_info = {prototype,
#if defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
                       prototype->GetTcParseTable()
#else
                       nullptr
#endif
  }